

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearObjectStatePdu.cpp
# Opt level: O2

int __thiscall DIS::LinearObjectStatePdu::getMarshalledSize(LinearObjectStatePdu *this)

{
  double *pdVar1;
  pointer pLVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  LinearSegmentParameter listElement;
  
  iVar3 = SyntheticEnvironmentFamilyPdu::getMarshalledSize
                    (&this->super_SyntheticEnvironmentFamilyPdu);
  iVar4 = EntityID::getMarshalledSize(&this->_objectID);
  iVar5 = EntityID::getMarshalledSize(&this->_referencedObjectID);
  iVar6 = SimulationAddress::getMarshalledSize(&this->_requesterID);
  iVar7 = SimulationAddress::getMarshalledSize(&this->_receivingID);
  iVar8 = ObjectType::getMarshalledSize(&this->_objectType);
  iVar3 = iVar8 + iVar6 + iVar5 + iVar4 + iVar3 + iVar7 + 4;
  lVar9 = 0x58;
  uVar10 = 0;
  while( true ) {
    pLVar2 = (this->_linearSegmentParameters).
             super__Vector_base<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_linearSegmentParameters).
                       super__Vector_base<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar2) / 0x68) <= uVar10)
    break;
    listElement._vptr_LinearSegmentParameter = (_func_int **)&PTR__LinearSegmentParameter_001b1658;
    listElement._segmentNumber = *(uchar *)((long)(&pLVar2->_segmentAppearance + -6) + lVar9);
    listElement._segmentAppearance._vptr_SixByteChunk = (_func_int **)&PTR__SixByteChunk_001b2300;
    listElement._segmentAppearance._otherParameters._4_2_ =
         *(undefined2 *)((pLVar2->_segmentAppearance)._otherParameters + lVar9 + 0xffffffffffffffac)
    ;
    listElement._segmentAppearance._otherParameters._0_4_ =
         *(undefined4 *)((long)(&pLVar2->_segmentAppearance + -5) + lVar9);
    listElement._location._vptr_Vector3Double = (_func_int **)&PTR__Vector3Double_001b2778;
    listElement._location._z = *(double *)((long)(&pLVar2->_segmentAppearance + -3) + lVar9);
    pdVar1 = (double *)((long)(&pLVar2->_segmentAppearance + -4) + lVar9);
    listElement._location._x = *pdVar1;
    listElement._location._y = pdVar1[1];
    listElement._orientation._vptr_Orientation = (_func_int **)&PTR__Orientation_001b1a40;
    listElement._orientation._phi =
         *(float *)((pLVar2->_segmentAppearance)._otherParameters + lVar9 + 0xffffffffffffffe0);
    listElement._orientation._8_8_ =
         *(undefined8 *)((long)(&pLVar2->_segmentAppearance + -2) + lVar9);
    listElement._pad1 =
         *(uint *)((pLVar2->_segmentAppearance)._otherParameters + lVar9 + 0xfffffffffffffff0);
    listElement._88_8_ =
         *(undefined8 *)
          ((long)&((LinearSegmentParameter *)(&pLVar2->_segmentAppearance + -1))->_segmentAppearance
          + lVar9 + 0xfffffffffffffff0U);
    iVar4 = LinearSegmentParameter::getMarshalledSize(&listElement);
    iVar3 = iVar3 + iVar4;
    LinearSegmentParameter::~LinearSegmentParameter(&listElement);
    uVar10 = uVar10 + 1;
    lVar9 = lVar9 + 0x68;
  }
  return iVar3;
}

Assistant:

int LinearObjectStatePdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = SyntheticEnvironmentFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _objectID.getMarshalledSize();  // _objectID
   marshalSize = marshalSize + _referencedObjectID.getMarshalledSize();  // _referencedObjectID
   marshalSize = marshalSize + 2;  // _updateNumber
   marshalSize = marshalSize + 1;  // _forceID
   marshalSize = marshalSize + 1;  // _numberOfSegments
   marshalSize = marshalSize + _requesterID.getMarshalledSize();  // _requesterID
   marshalSize = marshalSize + _receivingID.getMarshalledSize();  // _receivingID
   marshalSize = marshalSize + _objectType.getMarshalledSize();  // _objectType

   for(unsigned long long idx=0; idx < _linearSegmentParameters.size(); idx++)
   {
        LinearSegmentParameter listElement = _linearSegmentParameters[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}